

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow *window_00;
  bool bVar1;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiHoveredFlags flags_local;
  
  window_00 = GImGui->CurrentWindow;
  if (((GImGui->NavDisableMouseHover & 1U) == 0) || ((GImGui->NavDisableHighlight & 1U) != 0)) {
    if (((window_00->DC).LastItemStatusFlags & 1U) == 0) {
      g._7_1_ = false;
    }
    else {
      if ((flags & 3U) != 0) {
        __assert_fail("(flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                      ,0xb3c,"bool ImGui::IsItemHovered(ImGuiHoveredFlags)");
      }
      if ((GImGui->HoveredRootWindow == window_00->RootWindow) || ((flags & 0x40U) != 0)) {
        if ((((flags & 0x20U) == 0) &&
            (((GImGui->ActiveId != 0 && (GImGui->ActiveId != (window_00->DC).LastItemId)) &&
             ((GImGui->ActiveIdAllowOverlap & 1U) == 0)))) &&
           (GImGui->ActiveId != window_00->MoveId)) {
          g._7_1_ = false;
        }
        else {
          bVar1 = IsWindowContentHoverable(window_00,flags);
          if (bVar1) {
            if ((((window_00->DC).ItemFlags & 4U) == 0) || ((flags & 0x80U) != 0)) {
              if (((window_00->DC).LastItemId == window_00->MoveId) &&
                 ((window_00->WriteAccessed & 1U) != 0)) {
                g._7_1_ = false;
              }
              else {
                g._7_1_ = true;
              }
            }
            else {
              g._7_1_ = false;
            }
          }
          else {
            g._7_1_ = false;
          }
        }
      }
      else {
        g._7_1_ = false;
      }
    }
  }
  else {
    g._7_1_ = IsItemFocused();
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavDisableMouseHover && !g.NavDisableHighlight)
        return IsItemFocused();

    // Test for bounding box overlap, as updated as ItemAdd()
    if (!(window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    IM_ASSERT((flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows)) == 0);   // Flags not supported by this function

    // Test if we are hovering the right window (our window could be behind another window)
    // [2017/10/16] Reverted commit 344d48be3 and testing RootWindow instead. I believe it is correct to NOT test for RootWindow but this leaves us unable to use IsItemHovered() after EndChild() itself.
    // Until a solution is found I believe reverting to the test from 2017/09/27 is safe since this was the test that has been running for a long while.
    //if (g.HoveredWindow != window)
    //    return false;
    if (g.HoveredRootWindow != window->RootWindow && !(flags & ImGuiHoveredFlags_AllowWhenOverlapped))
        return false;

    // Test if another item is active (e.g. being dragged)
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && g.ActiveId != window->DC.LastItemId && !g.ActiveIdAllowOverlap && g.ActiveId != window->MoveId)
            return false;

    // Test if interactions on this window are blocked by an active popup or modal.
    // The ImGuiHoveredFlags_AllowWhenBlockedByPopup flag will be tested here.
    if (!IsWindowContentHoverable(window, flags))
        return false;

    // Test if the item is disabled
    if ((window->DC.ItemFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
        return false;

    // Special handling for the dummy item after Begin() which represent the title bar or tab.
    // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
    if (window->DC.LastItemId == window->MoveId && window->WriteAccessed)
        return false;
    return true;
}